

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_product.hpp
# Opt level: O2

void __thiscall
ranges::
cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
::cursor<false>::next_(cursor<false> *this)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  
  _Var1._M_current =
       *(double **)
        &(this->its_).
         super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
         ._M_head_impl.
         super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
         .
         super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
         .
         super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
         .
         super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
         .
         super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
         .value;
  if (_Var1._M_current !=
      (((this->view_->views_).
        super__Tuple_impl<0UL,_ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_ranges::ref_view<std::vector<char,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_ranges::reverse_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_false>
        ._M_head_impl.rng_.rng_)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    (this->its_).
    super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_ranges::basic_iterator<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>,_false>
    ._M_head_impl.
    super_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
    .
    super_readable_iterator_associated_types_base<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void>
    .
    super_mixin_base_t<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>_>
    .
    super_basic_mixin<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
    .
    super_box<ranges::detail::reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_void,_(ranges::detail::box_compress)0>
    .value = (reverse_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
              )(_Var1._M_current + 0xffffffffffffffff);
    return;
  }
  __assert_fail("i != last",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/view/cartesian_product.hpp"
                ,0xa2,
                "void ranges::cartesian_product_view<ranges::reverse_view<ranges::ref_view<std::vector<double>>>, ranges::ref_view<std::vector<char>>>::cursor<false>::next_(meta::size_t<1>) [Views = <ranges::reverse_view<ranges::ref_view<std::vector<double>>>, ranges::ref_view<std::vector<char>>>, IsConst_ = false]"
               );
}

Assistant:

void next_(meta::size_t<1>)
            {
                auto & v = std::get<0>(view_->views_);
                auto & i = std::get<0>(its_);
                auto const last = ranges::end(v);
                RANGES_EXPECT(i != last);
                ++i;
            }